

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Args.cpp
# Opt level: O0

bool idx2::OptVal(int NArgs,cstr *Args,cstr Opt,array<idx2::stref> *Vals)

{
  char *__s;
  long lVar1;
  int iVar2;
  size_t sVar3;
  undefined8 *puVar4;
  bool bVar5;
  stref Str;
  cstr Temp;
  i32 J;
  i32 I;
  array<idx2::stref> *Vals_local;
  cstr Opt_local;
  cstr *Args_local;
  int NArgs_local;
  
  Temp._4_4_ = 1;
  while( true ) {
    if (NArgs <= Temp._4_4_) {
      return false;
    }
    iVar2 = strncmp(Args[Temp._4_4_],Opt,0x20);
    Temp._0_4_ = Temp._4_4_;
    if (iVar2 == 0) break;
    Temp._4_4_ = Temp._4_4_ + 1;
  }
  while( true ) {
    Temp._0_4_ = (int)Temp + 1;
    bVar5 = false;
    if ((int)Temp < NArgs) {
      bVar5 = *Args[(int)Temp] != '-';
    }
    if (!bVar5) break;
    __s = Args[(int)Temp];
    sVar3 = strlen(__s);
    if (*(long *)(Vals + 0x20) <= *(long *)(Vals + 0x18)) {
      GrowCapacity<idx2::stref>(Vals,0);
    }
    lVar1 = *(long *)(Vals + 0x18);
    *(long *)(Vals + 0x18) = lVar1 + 1;
    puVar4 = (undefined8 *)(*(long *)Vals + lVar1 * 0x10);
    *puVar4 = __s;
    *(int *)(puVar4 + 1) = (int)sVar3;
  }
  return Temp._4_4_ + 1 < (int)Temp;
}

Assistant:

bool
OptVal(int NArgs, cstr* Args, cstr Opt, array<stref>* Vals)
{
  for (i32 I = 1; I < NArgs; ++I)
  {
    if (strncmp(Args[I], Opt, 32) == 0)
    {
      i32 J = I + 1;
      while (J < NArgs && Args[J][0] != '-')
      {
        cstr Temp;
        Temp = Args[J];
        stref Str = stref(Temp);
        PushBack(Vals, Str);
        ++J;
      }
      return J > I + 1;
    }
  }
  return false;
}